

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTypedConstraint.h
# Opt level: O0

btScalar btAdjustAngleToLimits
                   (btScalar angleInRadians,btScalar angleLowerLimitInRadians,
                   btScalar angleUpperLimitInRadians)

{
  float in_XMM0_Da;
  btScalar bVar1;
  btScalar bVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  btScalar diffLo_1;
  btScalar diffHi_1;
  btScalar diffHi;
  btScalar diffLo;
  float local_28;
  float local_24;
  float local_4;
  
  local_4 = in_XMM0_Da;
  if (in_XMM1_Da < in_XMM2_Da) {
    if (in_XMM1_Da <= in_XMM0_Da) {
      if (in_XMM2_Da < in_XMM0_Da) {
        bVar1 = btNormalizeAngle(2.965595e-39);
        bVar1 = btFabs(bVar1);
        bVar2 = btNormalizeAngle(2.965634e-39);
        bVar2 = btFabs(bVar2);
        local_28 = in_XMM0_Da;
        if (bVar2 < bVar1) {
          local_28 = in_XMM0_Da - 6.2831855;
        }
        local_4 = local_28;
      }
    }
    else {
      bVar1 = btNormalizeAngle(2.965403e-39);
      bVar1 = btFabs(bVar1);
      bVar2 = btNormalizeAngle(2.965442e-39);
      bVar2 = btFabs(bVar2);
      local_24 = in_XMM0_Da;
      if (bVar2 <= bVar1) {
        local_24 = in_XMM0_Da + 6.2831855;
      }
      local_4 = local_24;
    }
  }
  return local_4;
}

Assistant:

SIMD_FORCE_INLINE btScalar btAdjustAngleToLimits(btScalar angleInRadians, btScalar angleLowerLimitInRadians, btScalar angleUpperLimitInRadians)
{
	if(angleLowerLimitInRadians >= angleUpperLimitInRadians)
	{
		return angleInRadians;
	}
	else if(angleInRadians < angleLowerLimitInRadians)
	{
		btScalar diffLo = btFabs(btNormalizeAngle(angleLowerLimitInRadians - angleInRadians));
		btScalar diffHi = btFabs(btNormalizeAngle(angleUpperLimitInRadians - angleInRadians));
		return (diffLo < diffHi) ? angleInRadians : (angleInRadians + SIMD_2_PI);
	}
	else if(angleInRadians > angleUpperLimitInRadians)
	{
		btScalar diffHi = btFabs(btNormalizeAngle(angleInRadians - angleUpperLimitInRadians));
		btScalar diffLo = btFabs(btNormalizeAngle(angleInRadians - angleLowerLimitInRadians));
		return (diffLo < diffHi) ? (angleInRadians - SIMD_2_PI) : angleInRadians;
	}
	else
	{
		return angleInRadians;
	}
}